

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O3

void __thiscall
QNetworkHeadersPrivate::parseAndSetHeader
          (QNetworkHeadersPrivate *this,KnownHeaders key,QByteArrayView value)

{
  Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_> *this_00;
  Node<QNetworkRequest::KnownHeaders,_QVariant> *pNVar1;
  long in_FS_OFFSET;
  KnownHeaders copy;
  KnownHeaders local_58;
  KnownHeaders local_54;
  anon_union_24_3_e3d07ef4_for_data local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = key;
  if (value.m_data == (storage_type *)0x0) {
    QHash<QNetworkRequest::KnownHeaders,_QVariant>::removeImpl<QNetworkRequest::KnownHeaders>
              (&this->cookedHeaders,&local_58);
  }
  else {
    if (key == ContentLengthHeader) {
      local_50._0_4_ = 1;
      this_00 = (this->cookedHeaders).d;
      if (this_00 != (Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_> *)0x0) {
        pNVar1 = QHashPrivate::Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_>::
                 findNode<QNetworkRequest::KnownHeaders>(this_00,(KnownHeaders *)local_50.data);
        if (pNVar1 != (Node<QNetworkRequest::KnownHeaders,_QVariant> *)0x0) goto LAB_0019cc50;
      }
    }
    parseHeaderValue((QVariant *)&local_50,key,value);
    local_54 = key;
    QHash<QNetworkRequest::KnownHeaders,QVariant>::emplace<QVariant_const&>
              ((QHash<QNetworkRequest::KnownHeaders,QVariant> *)&this->cookedHeaders,&local_54,
               (QVariant *)&local_50);
    QVariant::~QVariant((QVariant *)&local_50);
  }
LAB_0019cc50:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkHeadersPrivate::parseAndSetHeader(QNetworkRequest::KnownHeaders key,
                                               QByteArrayView value)
{
    if (value.isNull()) {
        cookedHeaders.remove(key);
    } else if (key == QNetworkRequest::ContentLengthHeader
               && cookedHeaders.contains(QNetworkRequest::ContentLengthHeader)) {
        // Only set the cooked header "Content-Length" once.
        // See bug QTBUG-15311
    } else {
        cookedHeaders.insert(key, parseHeaderValue(key, value));
    }
}